

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.h
# Opt level: O0

void __thiscall
mp::
PowConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::Convert2ExpLog(PowConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *this,ItemType_conflict16 *con,int param_3)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  Var VVar1;
  Var VVar2;
  Arguments args;
  const_reference pvVar3;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
  *this_00;
  FunctionalConstraint *in_RSI;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  Var y_logx;
  Var logx;
  value_type y;
  value_type x;
  QuadraticExpr *in_stack_fffffffffffff728;
  undefined4 in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff734;
  QuadAndLinTerms *in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff740;
  Arguments in_stack_fffffffffffff744;
  LinTerms *in_stack_fffffffffffff748;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar4;
  QuadAndLinTerms *in_stack_fffffffffffff750;
  QuadraticFunctionalConstraint *fc;
  Context ctx;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff764;
  iterator in_stack_fffffffffffff768;
  vector<double,_std::allocator<double>_> *c;
  size_type in_stack_fffffffffffff770;
  QuadTerms *this_01;
  undefined1 local_850 [32];
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
  *in_stack_fffffffffffff7d0;
  int in_stack_fffffffffffff7dc;
  undefined4 in_stack_fffffffffffff7e0;
  value_type local_7ec;
  pointer local_7e8;
  pointer local_7e0;
  pointer local_7b8 [2];
  pointer local_7a8;
  _Any_data local_648;
  _Manager_type local_638;
  _Invoker_type p_Stack_630;
  _Any_data local_628;
  _Manager_type local_618;
  _Invoker_type p_Stack_610;
  undefined8 local_608;
  _Any_data _Stack_600;
  _Manager_type p_Stack_5f0;
  _Invoker_type local_5e8;
  EnvKeeper EStack_5e0;
  __buckets_ptr local_5d8;
  undefined1 local_410 [936];
  Var local_68;
  undefined4 local_54;
  Var local_20;
  value_type local_1c;
  value_type local_18;
  FunctionalConstraint *local_10;
  
  local_10 = in_RSI;
  CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>::GetArguments
            ((CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId> *)
             (in_RSI + 1));
  pvVar3 = std::array<int,_2UL>::operator[]
                     ((array<int,_2UL> *)
                      CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                      (size_type)in_stack_fffffffffffff728);
  local_18 = *pvVar3;
  CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>::GetArguments
            ((CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId> *)
             (local_10 + 1));
  pvVar3 = std::array<int,_2UL>::operator[]
                     ((array<int,_2UL> *)
                      CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                      (size_type)in_stack_fffffffffffff728);
  local_1c = *pvVar3;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  local_54 = local_18;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>
  ::CustomFunctionalConstraint
            ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>
              *)in_stack_fffffffffffff738,in_stack_fffffffffffff744);
  VVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResultVar2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::LogId>>
                    (in_stack_fffffffffffff758,
                     (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>
                      *)in_stack_fffffffffffff750);
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>
  ::~CustomFunctionalConstraint
            ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>
              *)0x2f7380);
  local_20 = VVar1;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  local_5e8 = (_Invoker_type)0x0;
  EStack_5e0.env_ = (Env *)0x0;
  _Stack_600._8_8_ = 0;
  p_Stack_5f0 = (_Manager_type)0x0;
  local_608._0_4_ = 0;
  local_608._4_4_ = 0;
  _Stack_600._M_unused._M_object = (void *)0x0;
  local_618 = (_Manager_type)0x0;
  p_Stack_610 = (_Invoker_type)0x0;
  local_628._M_unused._M_object = (void *)0x0;
  local_628._8_8_ = 0;
  local_638 = (_Manager_type)0x0;
  p_Stack_630 = (_Invoker_type)0x0;
  local_648._M_unused._M_object = (void *)0x0;
  local_648._8_8_ = 0;
  local_5d8 = (__buckets_ptr)0x0;
  LinTerms::LinTerms((LinTerms *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  local_7b8[0] = (pointer)0x3ff0000000000000;
  local_7b8[1] = (pointer)local_7b8;
  local_7a8 = (pointer)0x1;
  std::allocator<double>::allocator((allocator<double> *)0x2f742e);
  __l._M_len = in_stack_fffffffffffff770;
  __l._M_array = in_stack_fffffffffffff768;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),__l,
             (allocator_type *)in_stack_fffffffffffff758);
  local_7ec = local_1c;
  local_7e8 = (pointer)&local_7ec;
  local_7e0 = (pointer)0x1;
  this_01 = (QuadTerms *)&stack0xfffffffffffff813;
  std::allocator<int>::allocator((allocator<int> *)0x2f748e);
  __l_00._M_len = (size_type)this_01;
  __l_00._M_array = (iterator)in_stack_fffffffffffff768;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),__l_00,
             (allocator_type *)in_stack_fffffffffffff758);
  c = (vector<double,_std::allocator<double>_> *)&stack0xfffffffffffff7e3;
  VVar1 = local_20;
  std::allocator<int>::allocator((allocator<int> *)0x2f74ee);
  __l_01._M_len = (size_type)this_01;
  __l_01._M_array = (iterator)c;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),__l_01,
             (allocator_type *)in_stack_fffffffffffff758);
  QuadTerms::QuadTerms
            (this_01,c,
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff758);
  QuadAndLinTerms::QuadAndLinTerms
            (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
             (QuadTerms *)CONCAT44(in_stack_fffffffffffff744._M_elems[0],in_stack_fffffffffffff740))
  ;
  fc = (QuadraticFunctionalConstraint *)local_410;
  AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
            ((AlgebraicExpression<mp::QuadAndLinTerms> *)
             CONCAT44(in_stack_fffffffffffff744._M_elems[0],in_stack_fffffffffffff740),
             in_stack_fffffffffffff738,
             (double)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  pFVar4 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            *)(local_410 + 0x1c0);
  QuadraticFunctionalConstraint::QuadraticFunctionalConstraint
            ((QuadraticFunctionalConstraint *)
             CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),in_stack_fffffffffffff728
            );
  VVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::AssignResultVar2Args<mp::QuadraticFunctionalConstraint>(pFVar4,fc);
  ctx.value_ = (CtxVal)((ulong)fc >> 0x20);
  QuadraticFunctionalConstraint::~QuadraticFunctionalConstraint
            ((QuadraticFunctionalConstraint *)
             CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  AlgebraicExpression<mp::QuadAndLinTerms>::~AlgebraicExpression
            ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x2f75bb);
  QuadAndLinTerms::~QuadAndLinTerms
            ((QuadAndLinTerms *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  QuadTerms::~QuadTerms((QuadTerms *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff744._M_elems[0],in_stack_fffffffffffff740));
  std::allocator<int>::~allocator((allocator<int> *)0x2f75ef);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff744._M_elems[0],in_stack_fffffffffffff740));
  std::allocator<int>::~allocator((allocator<int> *)0x2f7609);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff744._M_elems[0],in_stack_fffffffffffff740));
  std::allocator<double>::~allocator((allocator<double> *)0x2f7623);
  LinTerms::~LinTerms((LinTerms *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  local_68 = VVar2;
  this_00 = (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
             *)BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ::GetMC(in_RDI);
  args._M_elems[0] = (_Type)FunctionalConstraint::GetResultVar(local_10);
  pFVar4 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            *)local_850;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
  ::CustomFunctionalConstraint(this_00,args);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  RedefineVariable<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::ExpId>>
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)CONCAT44(VVar1,in_stack_fffffffffffff7e0),in_stack_fffffffffffff7dc,
             in_stack_fffffffffffff7d0);
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
  ::~CustomFunctionalConstraint
            ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
              *)0x2f76a4);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  FunctionalConstraint::GetResultVar(local_10);
  FunctionalConstraint::GetContext(local_10);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr(pFVar4,(int)args._M_elems[0],ctx);
  return;
}

Assistant:

void Convert2ExpLog(const ItemType& con, int ) {
    auto x = con.GetArguments()[0];
    auto y = con.GetArguments()[1];
    auto logx = GetMC().AssignResultVar2Args(
        LogConstraint{ {x} });
    auto y_logx = GetMC().AssignResultVar2Args(
        QuadraticFunctionalConstraint(
            QuadraticExpr(
                QuadAndLinTerms( { }, { {1.0}, {y}, {logx} } ),
                0.0) ));
    GetMC().RedefineVariable(con.GetResultVar(),
                             ExpConstraint({y_logx}));

    /// propagate ctx into new constr,
    /// particularly into the arguments which are new constraints
    GetMC().PropagateResultOfInitExpr(
        con.GetResultVar(), con.GetContext());
  }